

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void j2k_read_plt(opj_j2k_t *j2k)

{
  opj_cio_t *cio;
  uint uVar1;
  int iVar2;
  
  cio = j2k->cio;
  uVar1 = cio_read(cio,2);
  cio_read(cio,1);
  for (iVar2 = uVar1 - 3; 0 < iVar2; iVar2 = iVar2 + -1) {
    cio_read(cio,1);
  }
  return;
}

Assistant:

static void j2k_read_plt(opj_j2k_t *j2k) {
	int len, i, Zplt, packet_len = 0, add;
	
	opj_cio_t *cio = j2k->cio;
	
	len = cio_read(cio, 2);		/* Lplt */
	Zplt = cio_read(cio, 1);	/* Zplt */
	for (i = len - 3; i > 0; i--) {
		add = cio_read(cio, 1);
		packet_len = (packet_len << 7) + add;	/* Iplt_i */
		if ((add & 0x80) == 0) {
			/* New packet */
			packet_len = 0;
		}
	}
}